

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

bool __thiscall CFG::anon_unknown_11::Optimizer::IsEmpty(Optimizer *this,Expression *Code)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  char cVar2;
  Block *pBVar3;
  bool bVar4;
  Expression **ppEVar5;
  byte unaff_R13B;
  undefined1 local_40 [8];
  Iterator __begin3;
  
  cVar2 = *(char *)&(this->super_RelooperRecursor).Parent;
  bVar4 = true;
  if (cVar2 != '\x16') {
    if (cVar2 == '\x01') {
      pAVar1 = (ArenaVector<wasm::Expression_*> *)(this + 2);
      __begin3.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pBVar3 = this[2].Entry;
      local_40 = (undefined1  [8])pAVar1;
      for (; bVar4 = (Block *)__begin3.parent == pBVar3,
          unaff_R13B = local_40 == (undefined1  [8])pAVar1 && bVar4,
          local_40 != (undefined1  [8])pAVar1 || !bVar4;
          __begin3.parent =
               (ArenaVector<wasm::Expression_*> *)
               ((long)&((__begin3.parent)->
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                       data + 1)) {
        ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)local_40);
        bVar4 = IsEmpty((Optimizer *)*ppEVar5,Code);
        if (!bVar4) break;
      }
    }
    bVar4 = (bool)(cVar2 == '\x01' & unaff_R13B);
  }
  return bVar4;
}

Assistant:

bool IsEmpty(wasm::Expression* Code) {
    if (Code->is<wasm::Nop>()) {
      return true; // a nop
    }
    if (auto* WasmBlock = Code->dynCast<wasm::Block>()) {
      for (auto* Item : WasmBlock->list) {
        if (!IsEmpty(Item)) {
          return false;
        }
      }
      return true; // block with no non-empty contents
    }
    return false;
  }